

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O0

int KINSetInfoHandlerFn(void *kinmem,KINInfoHandlerFn ihfun,void *ih_data)

{
  KINMem kin_mem;
  void *ih_data_local;
  KINInfoHandlerFn ihfun_local;
  void *kinmem_local;
  
  if (kinmem == (void *)0x0) {
    KINProcessError((KINMem)0x0,-1,"KINSOL","KINSetInfoHandlerFn","kinsol_mem = NULL illegal.");
    kinmem_local._4_4_ = -1;
  }
  else {
    *(KINInfoHandlerFn *)((long)kinmem + 0x268) = ihfun;
    *(void **)((long)kinmem + 0x270) = ih_data;
    kinmem_local._4_4_ = 0;
  }
  return kinmem_local._4_4_;
}

Assistant:

int KINSetInfoHandlerFn(void *kinmem, KINInfoHandlerFn ihfun, void *ih_data)
{
  KINMem kin_mem;

  if (kinmem == NULL) {
    KINProcessError(NULL, KIN_MEM_NULL, "KINSOL", "KINSetInfoHandlerFn", MSG_NO_MEM);
    return(KIN_MEM_NULL);
  }

  kin_mem = (KINMem) kinmem;

  kin_mem->kin_ihfun = ihfun;
  kin_mem->kin_ih_data = ih_data;

  return(KIN_SUCCESS);
}